

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatch.cxx
# Opt level: O2

bool __thiscall
cmVariableWatch::AddWatch
          (cmVariableWatch *this,string *variable,WatchMethod method,void *client_data,
          DeleteData delete_data)

{
  long *plVar1;
  vector<std::shared_ptr<cmVariableWatch::Pair>,std::allocator<std::shared_ptr<cmVariableWatch::Pair>>>
  *this_00;
  shared_ptr<cmVariableWatch::Pair> *pair;
  long *plVar2;
  shared_ptr<cmVariableWatch::Pair> p;
  shared_ptr<cmVariableWatch::Pair> local_40;
  
  std::make_shared<cmVariableWatch::Pair>();
  (local_40.super___shared_ptr<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->Method =
       method;
  (local_40.super___shared_ptr<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  ClientData = client_data;
  (local_40.super___shared_ptr<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  DeleteDataCall = delete_data;
  this_00 = (vector<std::shared_ptr<cmVariableWatch::Pair>,std::allocator<std::shared_ptr<cmVariableWatch::Pair>>>
             *)std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>_>_>_>
               ::operator[](&this->WatchMap,variable);
  plVar1 = *(long **)(this_00 + 8);
  for (plVar2 = *(long **)this_00; plVar2 != plVar1; plVar2 = plVar2 + 2) {
    if (((client_data != (void *)0x0) && (*(WatchMethod *)*plVar2 == method)) &&
       ((void *)((long *)*plVar2)[1] == client_data)) goto LAB_0029708e;
  }
  std::
  vector<std::shared_ptr<cmVariableWatch::Pair>,std::allocator<std::shared_ptr<cmVariableWatch::Pair>>>
  ::emplace_back<std::shared_ptr<cmVariableWatch::Pair>>(this_00,&local_40);
LAB_0029708e:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.super___shared_ptr<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return plVar2 == plVar1;
}

Assistant:

bool cmVariableWatch::AddWatch(const std::string& variable, WatchMethod method,
                               void* client_data /*=0*/,
                               DeleteData delete_data /*=0*/)
{
  auto p = std::make_shared<cmVariableWatch::Pair>();
  p->Method = method;
  p->ClientData = client_data;
  p->DeleteDataCall = delete_data;
  cmVariableWatch::VectorOfPairs& vp = this->WatchMap[variable];
  for (auto& pair : vp) {
    if (pair->Method == method && client_data &&
        client_data == pair->ClientData) {
      // Callback already exists
      return false;
    }
  }
  vp.push_back(std::move(p));
  return true;
}